

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool PairSearchHelperBoolTolerance
               (ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
               ON_RTreePairSearchCallbackResultBoolTolerance *a_result)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  
  lVar2 = (long)a_nodeA->m_count;
  bVar3 = lVar2 < 1;
  if (0 < lVar2) {
    paVar4 = &a_nodeA->m_branch[0].field_1;
    do {
      bVar1 = PairSearchOverlapHelper
                        ((ON_RTreeBBox *)(paVar4 + -6),&a_branchB->m_rect,a_result->m_tolerance);
      if (bVar1) {
        if (a_nodeA->m_level < 1) {
          bVar1 = (*a_result->m_resultCallbackBoolTolerance)
                            (a_result->m_context,(ON__INT_PTR)paVar4->m_child,
                             (ON__INT_PTR)(a_branchB->field_1).m_child,&a_result->m_tolerance);
        }
        else {
          bVar1 = PairSearchHelperBoolTolerance(paVar4->m_child,a_branchB,a_result);
        }
        if (bVar1 == false) {
          return bVar3;
        }
      }
      bVar1 = paVar4 + 1 < a_nodeA->m_branch + lVar2;
      bVar3 = !bVar1;
      paVar4 = paVar4 + 7;
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

static bool PairSearchHelperBoolTolerance(const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResultBoolTolerance* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  while (branchA < branchAmax)
  {
    if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
    {
      if (a_nodeA->m_level > 0)
      {
        if (!PairSearchHelperBoolTolerance(branchA->m_child, a_branchB, a_result))
          return false;
      }
      else
      {
        if (!a_result->m_resultCallbackBoolTolerance(a_result->m_context, branchA->m_id, a_branchB->m_id, &a_result->m_tolerance))
          return false;
      }
    }
    branchA++;
  }
  return true;
}